

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall
cmELFInternalImpl<cmELFTypes32>::cmELFInternalImpl
          (cmELFInternalImpl<cmELFTypes32> *this,cmELF *external,
          unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          *fin,ByteOrderType order)

{
  bool bVar1;
  ostream *poVar2;
  ELF_Half i;
  ushort uVar3;
  char *msg;
  FileType FVar4;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> local_1c0;
  char *local_1b8 [4];
  ostringstream e;
  
  local_1c0._M_head_impl =
       (fin->_M_t).
       super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  (fin->_M_t).
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_istream<char,_std::char_traits<char>_> *)0x0;
  cmELFInternal::cmELFInternal
            (&this->super_cmELFInternal,external,
             (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              *)&local_1c0,order);
  if (local_1c0._M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_1c0._M_head_impl + 8))();
  }
  local_1c0._M_head_impl = (basic_istream<char,_std::char_traits<char>_> *)0x0;
  (this->super_cmELFInternal)._vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternalImpl_008a1660;
  (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Read(this,&this->ELFHeader);
  if (bVar1) {
    uVar3 = (this->ELFHeader).e_type;
    FVar4 = (FileType)uVar3;
    switch(uVar3) {
    case 0:
      msg = "ELF file type is NONE.";
      goto LAB_002f64f1;
    case 1:
      break;
    case 2:
      FVar4 = FileTypeExecutable;
      break;
    case 3:
      FVar4 = FileTypeSharedLibrary;
      break;
    case 4:
      FVar4 = FileTypeCore;
      break;
    default:
      if ((uVar3 & 0xff00) == 0xfe00) {
        FVar4 = FileTypeSpecificOS;
      }
      else {
        if (uVar3 < 0xff00) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar2 = std::operator<<((ostream *)&e,"Unknown ELF file type ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__cxx11::stringbuf::str();
          cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,local_1b8[0]);
          std::__cxx11::string::~string((string *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          return;
        }
        FVar4 = FileTypeSpecificProc;
      }
    }
    (this->super_cmELFInternal).ELFType = FVar4;
    (this->super_cmELFInternal).Machine = (this->ELFHeader).e_machine;
    std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::resize
              (&this->SectionHeaders,(ulong)(this->ELFHeader).e_shnum);
    uVar3 = 0;
    do {
      if ((this->ELFHeader).e_shnum <= uVar3) {
        return;
      }
      bVar1 = LoadSectionHeader(this,uVar3);
      uVar3 = uVar3 + 1;
    } while (bVar1);
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"Failed to load section headers.");
  }
  else {
    msg = "Failed to read main ELF header.";
LAB_002f64f1:
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,msg);
  }
  return;
}

Assistant:

cmELFInternalImpl<Types>::cmELFInternalImpl(cmELF* external,
                                            std::unique_ptr<std::istream> fin,
                                            ByteOrderType order)
  : cmELFInternal(external, std::move(fin), order)
{
  // Read the main header.
  if (!this->Read(this->ELFHeader)) {
    this->SetErrorMessage("Failed to read main ELF header.");
    return;
  }

  // Determine the ELF file type.
  switch (this->ELFHeader.e_type) {
    case ET_NONE:
      this->SetErrorMessage("ELF file type is NONE.");
      return;
    case ET_REL:
      this->ELFType = cmELF::FileTypeRelocatableObject;
      break;
    case ET_EXEC:
      this->ELFType = cmELF::FileTypeExecutable;
      break;
    case ET_DYN:
      this->ELFType = cmELF::FileTypeSharedLibrary;
      break;
    case ET_CORE:
      this->ELFType = cmELF::FileTypeCore;
      break;
    default: {
      unsigned int eti = static_cast<unsigned int>(this->ELFHeader.e_type);
      if (eti >= ET_LOOS && eti <= ET_HIOS) {
        this->ELFType = cmELF::FileTypeSpecificOS;
        break;
      }
      if (eti >= ET_LOPROC && eti <= ET_HIPROC) {
        this->ELFType = cmELF::FileTypeSpecificProc;
        break;
      }
      std::ostringstream e;
      e << "Unknown ELF file type " << eti;
      this->SetErrorMessage(e.str().c_str());
      return;
    }
  }

  this->Machine = this->ELFHeader.e_machine;

  // Load the section headers.
  this->SectionHeaders.resize(this->ELFHeader.e_shnum);
  for (ELF_Half i = 0; i < this->ELFHeader.e_shnum; ++i) {
    if (!this->LoadSectionHeader(i)) {
      this->SetErrorMessage("Failed to load section headers.");
      return;
    }
  }
}